

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::get_eq_marks
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  LO size_in;
  ulong uVar7;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *pvVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  int iVar14;
  Read<signed_char> RVar15;
  Write<signed_char> eq_marks_w;
  Read<int> d_sorted_class_ids;
  vector<int,_std::allocator<int>_> sorted_class_ids;
  Read<int> eq_class_ids;
  Read<signed_char> eq_class_dims;
  HostWrite<int> h_sorted_class_ids;
  type f;
  Write<signed_char> local_1b8;
  undefined1 local_1a0 [32];
  Int local_180;
  Alloc *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  Alloc *local_168;
  element_type *local_160;
  int local_158;
  Write<signed_char> local_150;
  Read<signed_char> local_140;
  vector<int,_std::allocator<int>_> local_130;
  Alloc *local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  element_type *local_100;
  HostWrite<int> local_f8;
  Write<int> local_e8;
  Alloc *local_d8;
  element_type *peStack_d0;
  Alloc *local_c8;
  element_type *peStack_c0;
  Int local_b8;
  Alloc *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a8;
  Alloc *local_a0;
  element_type *peStack_98;
  int local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  Int local_60;
  Alloc *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Alloc *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  int local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_130,class_ids);
  piVar6 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar12 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar12,piVar6);
    piVar12 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  piVar6 = local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar3 = (Alloc *)(local_1a0 + 0x10);
  local_1a0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
  HostWrite<int>::HostWrite
            (&local_f8,(LO)((ulong)((long)piVar12 - (long)piVar6) >> 2),(string *)local_1a0);
  pvVar8 = extraout_RDX;
  if ((Alloc *)local_1a0._0_8_ != pAVar3) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
    pvVar8 = extraout_RDX_00;
  }
  __n = (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    __n = ((long)__n >> 2) + (ulong)((long)__n >> 2 == 0);
    lVar9 = 0;
    sVar10 = 0;
    do {
      *(int *)((long)local_f8.write_.shared_alloc_.direct_ptr + (lVar9 >> 0x1e)) =
           local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[sVar10];
      sVar10 = sVar10 + 1;
      lVar9 = lVar9 + 0x100000000;
      pvVar8 = local_f8.write_.shared_alloc_.direct_ptr;
    } while (__n != sVar10);
  }
  HostWrite<int>::write((HostWrite<int> *)&local_e8,(int)&local_f8,pvVar8,__n);
  Read<int>::Read(&local_140,&local_e8);
  if (((ulong)local_e8.shared_alloc_.alloc & 7) == 0 && local_e8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_e8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.shared_alloc_.alloc);
      operator_delete(local_e8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_140.write_.shared_alloc_.alloc & 1) == 0) {
    uVar7 = (local_140.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar7 = (ulong)local_140.write_.shared_alloc_.alloc >> 3;
  }
  local_1a0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_108,(Int)mesh,(string *)(ulong)(uint)class_dim);
  if ((Alloc *)local_1a0._0_8_ != pAVar3) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
  }
  local_1a0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"class_id","");
  Mesh::get_array<int>((Mesh *)&local_118,(Int)mesh,(string *)(ulong)(uint)class_dim);
  if ((Alloc *)local_1a0._0_8_ != pAVar3) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
  }
  size_in = Mesh::nents(mesh,class_dim);
  local_1a0._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"");
  Write<signed_char>::Write(&local_1b8,size_in,(string *)local_1a0);
  if ((Alloc *)local_1a0._0_8_ != pAVar3) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
  }
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8.shared_alloc_.alloc;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_1b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.shared_alloc_.alloc)->use_count = (local_1b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_78 = (element_type *)local_1b8.shared_alloc_.direct_ptr;
  local_70._M_pi = local_108._M_pi;
  if (((ulong)local_108._M_pi & 7) == 0 && (Alloc *)local_108._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_108._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_68 = local_100;
  local_58 = local_140.write_.shared_alloc_.alloc;
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58 = (Alloc *)((local_140.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_140.write_.shared_alloc_.alloc)->use_count =
           (local_140.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140.write_.shared_alloc_.direct_ptr;
  local_48 = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48 = (Alloc *)(local_118->size * 8 + 1);
    }
    else {
      local_118->use_count = local_118->use_count + 1;
    }
  }
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110;
  local_90 = (int)(uVar7 >> 2);
  local_d8 = (Alloc *)local_80._M_pi;
  if (((ulong)local_80._M_pi & 7) == 0 && (Alloc *)local_80._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)((long)(local_80._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_d0 = (element_type *)local_1b8.shared_alloc_.direct_ptr;
  local_c8 = (Alloc *)local_70._M_pi;
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)((long)(local_70._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_c0 = local_100;
  local_b0 = local_58;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  p_Stack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_140.write_.shared_alloc_.direct_ptr;
  local_a0 = local_48;
  if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_48->size * 8 + 1);
    }
    else {
      local_48->use_count = local_48->use_count + 1;
    }
  }
  peStack_98 = local_110;
  local_b8 = class_dim;
  local_60 = class_dim;
  local_38 = local_90;
  if (0 < size_in) {
    local_1a0._8_8_ = local_1b8.shared_alloc_.direct_ptr;
    local_1a0._0_8_ = local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_1a0._0_8_ = local_d8->size * 8 + 1;
    }
    local_d8 = (Alloc *)0x0;
    peStack_d0 = (element_type *)0x0;
    local_1a0._24_8_ = local_100;
    local_1a0._16_8_ = local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_1a0._16_8_ = local_c8->size * 8 + 1;
    }
    local_c8 = (Alloc *)0x0;
    peStack_c0 = (element_type *)0x0;
    local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_140.write_.shared_alloc_.direct_ptr;
    local_178 = local_b0;
    if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
      local_b0->use_count = local_b0->use_count + -1;
      local_178 = (Alloc *)(local_b0->size * 8 + 1);
    }
    local_b0 = (Alloc *)0x0;
    p_Stack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_160 = local_110;
    local_168 = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      local_a0->use_count = local_a0->use_count + -1;
      local_168 = (Alloc *)(local_a0->size * 8 + 1);
    }
    local_a0 = (Alloc *)0x0;
    peStack_98 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar9 = 0;
    do {
      if ((char)class_dim == *(char *)((long)&local_100->library_ + lVar9)) {
        iVar11 = 0;
        if (0 < local_90) {
          iVar4 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                    *)&local_110->library_)->_M_ptr + lVar9 * 4);
          iVar14 = local_90 + -1;
          do {
            uVar13 = (uint)(iVar14 + iVar11) >> 1;
            iVar5 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                      *)local_140.write_.shared_alloc_.direct_ptr)->_M_ptr +
                            (ulong)uVar13 * 4);
            if (iVar5 < iVar4) {
              iVar11 = uVar13 + 1;
            }
            else {
              if (iVar5 <= iVar4) {
                iVar11 = 1;
                goto LAB_00313b32;
              }
              iVar14 = uVar13 - 1;
            }
          } while (iVar11 <= iVar14);
          goto LAB_00313b2f;
        }
      }
      else {
LAB_00313b2f:
        iVar11 = 0;
      }
LAB_00313b32:
      *(char *)((long)&(((Graph *)local_1b8.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.
                       alloc + lVar9) = (char)iVar11;
      lVar9 = lVar9 + 1;
    } while (size_in != (int)lVar9);
    local_180 = class_dim;
    local_158 = local_90;
    get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
              ((__0 *)local_1a0);
  }
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)&local_d8);
  local_150.shared_alloc_.alloc = local_1b8.shared_alloc_.alloc;
  local_150.shared_alloc_.direct_ptr = local_1b8.shared_alloc_.direct_ptr;
  if ((((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
       local_1b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_1b8.shared_alloc_.alloc)->use_count = (local_1b8.shared_alloc_.alloc)->use_count + -1;
    local_150.shared_alloc_.alloc = (Alloc *)((local_1b8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_1b8.shared_alloc_.alloc = (Alloc *)0x0;
  local_1b8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_150);
  pAVar3 = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_150.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_150.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  get_eq_marks(Omega_h::Mesh*,int,std::vector<int,std::allocator<int>>const&)::$_0::~__0
            ((__0 *)&local_80);
  pAVar3 = local_1b8.shared_alloc_.alloc;
  pvVar8 = extraout_RDX_01;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1b8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1b8.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar8 = extraout_RDX_02;
    }
  }
  if (((ulong)local_118 & 7) == 0 && local_118 != (Alloc *)0x0) {
    piVar1 = &local_118->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118);
      operator_delete(local_118,0x48);
      pvVar8 = extraout_RDX_03;
    }
  }
  if (((ulong)local_108._M_pi & 7) == 0 && (Alloc *)local_108._M_pi != (Alloc *)0x0) {
    p_Var2 = local_108._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_108._M_pi);
      operator_delete(local_108._M_pi,0x48);
      pvVar8 = extraout_RDX_04;
    }
  }
  if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
      local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
      operator_delete(local_140.write_.shared_alloc_.alloc,0x48);
      pvVar8 = extraout_RDX_05;
    }
  }
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_f8.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(local_f8.write_.shared_alloc_.alloc,0x48);
      pvVar8 = extraout_RDX_06;
    }
  }
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pvVar8 = extraout_RDX_07;
  }
  RVar15.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar15.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar15.write_.shared_alloc_;
}

Assistant:

Read<I8> get_eq_marks(
    Mesh* mesh, Int class_dim, std::vector<ClassId> const& class_ids) {
  auto sorted_class_ids = class_ids;
  std::sort(begin(sorted_class_ids), end(sorted_class_ids));
  HostWrite<LO> h_sorted_class_ids(LO(sorted_class_ids.size()));
  for (size_t i = 0; i < sorted_class_ids.size(); ++i) {
    h_sorted_class_ids[LO(i)] = sorted_class_ids[i];
  }
  auto d_sorted_class_ids = Read<ClassId>(h_sorted_class_ids.write());
  auto nclass_ids = d_sorted_class_ids.size();
  auto eq_class_dims = mesh->get_array<I8>(class_dim, "class_dim");
  auto eq_class_ids = mesh->get_array<LO>(class_dim, "class_id");
  auto neq = mesh->nents(class_dim);
  Write<I8> eq_marks_w(neq);
  auto f = OMEGA_H_LAMBDA(LO eq) {
    eq_marks_w[eq] = I8((eq_class_dims[eq] == I8(class_dim)) &&
                        (-1 != binary_search(d_sorted_class_ids,
                                   eq_class_ids[eq], nclass_ids)));
  };
  parallel_for(neq, f, "mark_class_closures");
  return eq_marks_w;
}